

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# load_store.c
# Opt level: O2

void load_store_ro(arm7tdmi_t *state,thumbinstr_t *thminstr)

{
  ushort uVar1;
  byte bVar2;
  uint32_t data;
  _func_void_uint32_t_uint32_t_access_type_t *UNRECOVERED_JUMPTABLE;
  uint32_t uVar3;
  uint uVar4;
  
  uVar1 = thminstr->raw;
  uVar3 = *(int *)((long)state->r + (ulong)(uVar1 >> 4 & 0x1c)) +
          *(int *)((long)state->r + (ulong)(uVar1 >> 1 & 0x1c));
  if ((uVar1 >> 0xb & 1) == 0) {
    uVar4 = state->r[uVar1 & 7];
    if ((uVar1 >> 10 & 1) == 0) {
      UNRECOVERED_JUMPTABLE = state->write_word;
    }
    else {
      UNRECOVERED_JUMPTABLE = (_func_void_uint32_t_uint32_t_access_type_t *)state->write_byte;
      uVar4 = uVar4 & 0xff;
    }
    (*UNRECOVERED_JUMPTABLE)(uVar3,uVar4,ACCESS_NONSEQUENTIAL);
    return;
  }
  if ((uVar1 >> 10 & 1) == 0) {
    data = (*state->read_word)(uVar3,ACCESS_NONSEQUENTIAL);
    uVar3 = arm_ror((status_register_t *)0x0,data,(uVar3 & 3) << 3);
    uVar1 = thminstr->raw;
    if (2 < gba_log_verbosity) {
      printf("[DEBUG] Set r%d to 0x%08X\n",(ulong)(uVar1 & 7),(ulong)uVar3);
    }
    state->r[uVar1 & 7] = uVar3;
    return;
  }
  bVar2 = (*state->read_byte)(uVar3,ACCESS_NONSEQUENTIAL);
  uVar1 = thminstr->raw;
  if (2 < gba_log_verbosity) {
    printf("[DEBUG] Set r%d to 0x%08X\n",(ulong)(uVar1 & 7),(ulong)bVar2);
  }
  state->r[uVar1 & 7] = (uint)bVar2;
  (*state->cpu_idle)(1);
  return;
}

Assistant:

void load_store_ro(arm7tdmi_t* state, thumbinstr_t* thminstr) {
    load_store_ro_t* instr = &thminstr->LOAD_STORE_RO;
    word address = get_register(state, instr->rb) + get_register(state, instr->ro);
    if (instr->l) {
        if (instr->b) {
            word value = state->read_byte(address, ACCESS_NONSEQUENTIAL);
            set_register(state, instr->rd, value);
            state->cpu_idle(1);
        } else {
            word value = state->read_word(address, ACCESS_NONSEQUENTIAL);
            value = arm_ror(NULL, value, (address & 3u) << 3);
            set_register(state, instr->rd, value);
        }
    } else {
        word value = get_register(state, instr->rd);
        if (instr->b) {
            byte bytevalue = value & 0xFF;
            state->write_byte(address, bytevalue, ACCESS_NONSEQUENTIAL);
        } else {
            state->write_word(address, value, ACCESS_NONSEQUENTIAL);
        }
    }
}